

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O3

int32_t adt_utf8_readCodePoint(uint8_t *strBuf,int32_t bufLen,int *codePoint)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  
  if ((codePoint == (int *)0x0 || strBuf == (uint8_t *)0x0) || bufLen < 0) {
    return -1;
  }
  bVar1 = *strBuf;
  uVar6 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    uVar3 = (uint)bVar1;
    if ((uVar6 & 0xffffffe0) == 0xc0) {
      uVar2 = 2;
      uVar6 = 0x1f;
    }
    else if ((uVar3 & 0xfffffff0) == 0xe0) {
      uVar2 = 3;
      uVar6 = 0xf;
    }
    else {
      if ((uVar3 & 0xfffffff8) != 0xf0) {
        return 0;
      }
      uVar2 = 4;
      uVar6 = 7;
    }
    if (uVar2 <= (uint)bufLen) {
      uVar6 = uVar6 & uVar3;
      if ((char)bVar1 < '\0') {
        iVar4 = uVar2 + 1;
        pbVar5 = strBuf + 1;
        do {
          if ((*pbVar5 & 0xffffffc0) != 0x80) {
            return -2;
          }
          uVar6 = *pbVar5 & 0x3f | uVar6 << 6;
          iVar4 = iVar4 + -1;
          pbVar5 = pbVar5 + 1;
        } while (2 < iVar4);
      }
      goto LAB_00122360;
    }
  }
  else {
    uVar2 = 1;
    if (bufLen != 0) {
LAB_00122360:
      *codePoint = uVar6;
      return uVar2;
    }
  }
  return 0;
}

Assistant:

DYN_STATIC int32_t adt_utf8_readCodePoint(const uint8_t *strBuf, int32_t bufLen, int *codePoint)
{
   int tmp = 0;
   int32_t retval = 0;
   if ( (strBuf == 0) || (bufLen < 0) || (codePoint == 0) )
   {
      return ADT_UTF8_INVALID_ARGUMENT;
   }
   if (bufLen > 0)
   {
      int32_t expectedLen = 0;
      uint8_t c = (uint8_t) *strBuf++;
      if (c < 128u)
      {
         expectedLen = 1;
         tmp = c;
      }
      else if ( ( (c & 0xe0) == 0xc0) )
      {
         expectedLen = 2;
         tmp = c & 0x1F;

      }
      else if ( ( (c & 0xf0) == 0xe0) )
      {
         expectedLen = 3;
         tmp = c & 0x0F;
      }
      else if ( ( (c & 0xf8) == 0xf0) )
      {
         expectedLen = 4;
         tmp = c & 0x07;
      }
      else
      {
         retval = ADT_UTF8_INVALID_ENCODING;
      }
      if ( expectedLen > 0 )
      {
         if (bufLen >= expectedLen)
         {
            retval = expectedLen--;
            while(expectedLen > 0)
            {
               c = (uint8_t) *strBuf++;
               if ( ( (c & 0xc0) != 0x80) )
               {
                  retval = ADT_UTF8_INVALID_ENCODING;
                  break;
               }
               tmp <<= 6;
               tmp |= c & 0x3F;
               --expectedLen;
            }
         }
      }
      else
      {
         retval = 0; //not enough bytes in buffer, try again later
      }
   }
   if (retval > 0)
   {
      *codePoint = tmp;
   }
   return retval;
}